

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

bool dxil_spv::analyze_ags_wmma_store(Impl *impl,StoreInst *store)

{
  uint uVar1;
  iterator iVar2;
  Value *pVVar3;
  GetElementPtrInst *this;
  LoggingCallback p_Var4;
  void *pvVar5;
  mapped_type *pmVar6;
  char *__ptr;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sStack_1040;
  SplitScaleBias split;
  AllocaInst *alloca;
  char buffer [4096];
  
  buffer._0_8_ = LLVMBC::Instruction::getOperand(&store->super_Instruction,0);
  iVar2 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->ags).coopmat_component_mapping._M_h,(key_type *)buffer);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
      ._M_cur == (__node_type *)0x0) {
    return true;
  }
  pVVar3 = LLVMBC::Instruction::getOperand(&store->super_Instruction,1);
  this = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(pVVar3);
  if (this == (GetElementPtrInst *)0x0) {
    p_Var4 = get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Trying to store a WMMA matrix without GEP.\n";
      sStack_1040 = 0x34;
      goto LAB_0016af99;
    }
    builtin_strncpy(buffer + 0x10,"a WMMA matrix without GEP.\n",0x1c);
    uVar7._0_1_ = 'T';
    uVar7._1_1_ = 'r';
    uVar7._2_1_ = 'y';
    uVar7._3_1_ = 'i';
    uVar8._0_1_ = 'n';
    uVar8._1_1_ = 'g';
    uVar8._2_1_ = ' ';
    uVar8._3_1_ = 't';
    buffer[8] = 'o';
    buffer[9] = ' ';
    buffer[10] = 's';
    buffer[0xb] = 't';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 'r';
    uVar9._2_1_ = 'e';
    uVar9._3_1_ = ' ';
  }
  else {
    pVVar3 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    alloca = LLVMBC::dyn_cast<LLVMBC::AllocaInst>(pVVar3);
    if ((alloca == (AllocaInst *)0x0) ||
       (uVar1 = LLVMBC::Instruction::getNumOperands(&this->super_Instruction), uVar1 < 3)) {
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Trying to store WMMA to something not Alloca.\n";
        sStack_1040 = 0x37;
        goto LAB_0016af99;
      }
      builtin_strncpy(buffer + 0x10,"WMMA to something not Alloca.\n",0x1f);
      uVar7._0_1_ = 'T';
      uVar7._1_1_ = 'r';
      uVar7._2_1_ = 'y';
      uVar7._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'g';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 't';
      buffer[8] = 'o';
      buffer[9] = ' ';
      buffer[10] = 's';
      buffer[0xb] = 't';
      uVar9._0_1_ = 'o';
      uVar9._1_1_ = 'r';
      uVar9._2_1_ = 'e';
      uVar9._3_1_ = ' ';
    }
    else {
      pVVar3 = LLVMBC::Instruction::getOperand(&this->super_Instruction,2);
      split_index_scale_bias(&split,pVVar3);
      if (split.stride == 0) {
        return false;
      }
      pmVar6 = std::__detail::
               _Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->alloca_ags_tracking,&alloca);
      if ((pmVar6->override_element_stride != 0) &&
         (split.stride != 0xffffffff && pmVar6->override_element_stride != split.stride)) {
        p_Var4 = get_thread_log_callback();
        if (p_Var4 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Mismatch WMMA stride.\n";
          sStack_1040 = 0x1f;
          goto LAB_0016af99;
        }
        buffer[0] = 'M';
        buffer[1] = 'i';
        buffer[2] = 's';
        buffer[3] = 'm';
        buffer[4] = 'a';
        buffer[5] = 't';
        buffer[6] = 'c';
        buffer[7] = 'h';
        builtin_strncpy(buffer + 8," WMMA stride.\n",0xf);
        goto LAB_0016ae8a;
      }
      if ((pmVar6->override_element_type != 0) &&
         (pmVar6->override_element_type !=
          *(Id *)((long)iVar2.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                        ._M_cur + 0x10))) {
        p_Var4 = get_thread_log_callback();
        if (p_Var4 != (LoggingCallback)0x0) {
          builtin_strncpy(buffer,"Mismatch WMMA type.\n",0x15);
          goto LAB_0016ae8a;
        }
        __ptr = "[ERROR]: Mismatch WMMA type.\n";
        sStack_1040 = 0x1d;
LAB_0016af99:
        fwrite(__ptr,sStack_1040,1,_stderr);
        fflush(_stderr);
        return false;
      }
      if (split.stride == 0xffffffff) {
        split.stride = 8;
        pmVar6->override_element_stride = 8;
        split.elem = split.elem & 7;
      }
      if (split.elem ==
          *(uint32_t *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                  ._M_cur + 0x14)) {
        pmVar6->override_element_stride = split.stride;
        pmVar6->override_element_type =
             *(Id *)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                           ._M_cur + 0x10);
        return true;
      }
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Unexpected component mapping in WMMA store.\n";
        sStack_1040 = 0x35;
        goto LAB_0016af99;
      }
      builtin_strncpy(buffer + 0x10,"nent mapping in WMMA store.\n",0x1d);
      uVar7._0_1_ = 'U';
      uVar7._1_1_ = 'n';
      uVar7._2_1_ = 'e';
      uVar7._3_1_ = 'x';
      uVar8._0_1_ = 'p';
      uVar8._1_1_ = 'e';
      uVar8._2_1_ = 'c';
      uVar8._3_1_ = 't';
      buffer[8] = 'e';
      buffer[9] = 'd';
      buffer[10] = ' ';
      buffer[0xb] = 'c';
      uVar9._0_1_ = 'o';
      uVar9._1_1_ = 'm';
      uVar9._2_1_ = 'p';
      uVar9._3_1_ = 'o';
    }
  }
  buffer[4] = (char)uVar8;
  buffer[5] = SUB41(uVar8,1);
  buffer[6] = SUB41(uVar8,2);
  buffer[7] = SUB41(uVar8,3);
  buffer[0] = (char)uVar7;
  buffer[1] = SUB41(uVar7,1);
  buffer[2] = SUB41(uVar7,2);
  buffer[3] = SUB41(uVar7,3);
  buffer[0xc] = (char)uVar9;
  buffer._13_2_ = SUB42(uVar9,1);
  buffer[0xf] = SUB41(uVar9,3);
LAB_0016ae8a:
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var4)(pvVar5,Error,buffer);
  return false;
}

Assistant:

bool analyze_ags_wmma_store(Converter::Impl &impl, const llvm::StoreInst *store)
{
	auto itr = impl.ags.coopmat_component_mapping.find(store->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end())
		return true;

	const auto *gep = llvm::dyn_cast<llvm::GetElementPtrInst>(store->getOperand(1));
	if (!gep)
	{
		LOGE("Trying to store a WMMA matrix without GEP.\n");
		return false;
	}

	auto *alloca = llvm::dyn_cast<llvm::AllocaInst>(gep->getOperand(0));
	if (!alloca || gep->getNumOperands() < 3)
	{
		LOGE("Trying to store WMMA to something not Alloca.\n");
		return false;
	}

	const auto *index = gep->getOperand(2);
	auto split = split_index_scale_bias(index);
	if (!split.stride)
		return false;

	auto &tracking = impl.alloca_ags_tracking[alloca];
	if (tracking.override_element_stride &&
	    tracking.override_element_stride != split.stride &&
	    split.stride != UINT32_MAX)
	{
		LOGE("Mismatch WMMA stride.\n");
		return false;
	}

	if (tracking.override_element_type && tracking.override_element_type != itr->second.type_id)
	{
		LOGE("Mismatch WMMA type.\n");
		return false;
	}

	if (split.stride == UINT32_MAX)
	{
		// Somewhat hacky, but this is the AGS assumption.
		tracking.override_element_stride = 8;

#if 0
		// This breaks in some cases.
		if (split.elem > itr->second.component)
		{
			if (tracking.override_element_stride == 0)
			{
				// We can deduce stride from this.
				tracking.override_element_stride = split.elem - itr->second.component;
			}
			else
			{
				// This isn't perfect if there are gaps in the writes, but we can assume that's not the case.
				tracking.override_element_stride =
					std::min<uint32_t>(split.elem - itr->second.component,
									   tracking.override_element_stride);
			}
		}
#endif
	}

	if (split.stride == UINT32_MAX && tracking.override_element_stride)
	{
		split.stride = tracking.override_element_stride;
		split.elem %= split.stride;
	}

	// If we have constant indices we don't know how the mapping works yet.
	if (split.elem != itr->second.component)
	{
		LOGE("Unexpected component mapping in WMMA store.\n");
		return false;
	}

	if (split.stride != UINT32_MAX)
		tracking.override_element_stride = split.stride;
	tracking.override_element_type = itr->second.type_id;
	return true;
}